

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::FileError::FileError(FileError *this,string *ename,string *msg,ExitCodes exit_code)

{
  undefined4 in_ECX;
  string *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  string local_60 [32];
  string local_40 [28];
  ExitCodes in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  string *ename_00;
  
  ename_00 = in_RDX;
  ::std::__cxx11::string::string(local_40,in_RSI);
  ::std::__cxx11::string::string(local_60,(string *)in_RDX);
  ParseError::ParseError
            ((ParseError *)in_RSI,ename_00,(string *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
  ::std::__cxx11::string::~string(local_60);
  ::std::__cxx11::string::~string(local_40);
  *in_RDI = &PTR__FileError_001b6a78;
  return;
}

Assistant:

static FileError Missing(std::string name) { return FileError(name + " was not readable (missing?)"); }